

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxDomain.cpp
# Opt level: O0

void __thiscall amrex::BoxDomain::add(BoxDomain *this,Box *b)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  const_iterator in_RDI;
  BoxList *tmpbl;
  Box *cbx;
  iterator __end2;
  iterator __begin2;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range2;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  BoxDomain *__range1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> check;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> tmp;
  iterator in_stack_fffffffffffffe28;
  iterator in_stack_fffffffffffffe30;
  value_type *in_stack_fffffffffffffe38;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_fffffffffffffe40;
  Box *in_stack_fffffffffffffe48;
  iterator in_stack_fffffffffffffe50;
  const_iterator in_stack_fffffffffffffe58;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe70;
  const_iterator in_stack_fffffffffffffe78;
  iterator in_stack_fffffffffffffe80;
  undefined8 local_fc;
  undefined8 local_f4;
  undefined8 local_ec;
  uint local_e4;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  reference local_90;
  Box *local_88;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> local_80;
  Box *local_78;
  reference local_70;
  Box *local_68;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_60 [4];
  Box local_40 [2];
  
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1277fe1);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1277ff3);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_60[0]._M_current = (Box *)BoxList::begin(in_stack_fffffffffffffe28._M_current);
  local_68 = (Box *)BoxList::end(in_stack_fffffffffffffe28._M_current);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)in_stack_fffffffffffffe30._M_current,
                            (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)in_stack_fffffffffffffe28._M_current), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               ::operator*(local_60);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::clear
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x127807e);
    local_78 = local_40;
    local_80._M_current =
         (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                          (in_stack_fffffffffffffe28._M_current);
    local_88 = (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
                                (in_stack_fffffffffffffe28._M_current);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                               *)in_stack_fffffffffffffe30._M_current,
                              (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                               *)in_stack_fffffffffffffe28._M_current), bVar1) {
      local_90 = __gnu_cxx::
                 __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                 ::operator*(&local_80);
      bVar1 = Box::intersects(in_stack_fffffffffffffe50._M_current,in_stack_fffffffffffffe48);
      if (bVar1) {
        boxDiff(in_stack_fffffffffffffe58._M_current,in_stack_fffffffffffffe50._M_current);
        local_98 = local_b8;
        in_stack_fffffffffffffe80 =
             std::end<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
                       (in_stack_fffffffffffffe28._M_current);
        __gnu_cxx::
        __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
        __normal_iterator<amrex::Box*>
                  ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    *)in_stack_fffffffffffffe30._M_current,
                   (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    *)in_stack_fffffffffffffe28._M_current);
        in_stack_fffffffffffffe78 = std::begin<amrex::BoxList>(in_stack_fffffffffffffe28._M_current)
        ;
        in_stack_fffffffffffffe70 = std::end<amrex::BoxList>(in_stack_fffffffffffffe28._M_current);
        std::vector<amrex::Box,std::allocator<amrex::Box>>::
        insert<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                   in_stack_fffffffffffffe70._M_current,in_RDI,
                   (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    )in_stack_fffffffffffffe80._M_current,
                   (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    )in_stack_fffffffffffffe78._M_current);
        Box::Box(in_stack_fffffffffffffe30._M_current);
        *(undefined8 *)(local_90->smallend).vect = local_fc;
        *(undefined8 *)((local_90->smallend).vect + 2) = local_f4;
        *(undefined8 *)((local_90->bigend).vect + 1) = local_ec;
        (local_90->btype).itype = local_e4;
        BoxList::~BoxList((BoxList *)0x1278238);
      }
      __gnu_cxx::
      __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
      operator++(&local_80);
    }
    in_stack_fffffffffffffe58._M_current = local_40;
    iVar2 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                      (in_stack_fffffffffffffe28._M_current);
    iVar3 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
                      (in_stack_fffffffffffffe28._M_current);
    in_stack_fffffffffffffe60 =
         std::
         remove_if<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,amrex::BoxDomain::add(amrex::Box_const&)::__0>
                   (iVar2._M_current,iVar3._M_current);
    __gnu_cxx::
    __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
    __normal_iterator<amrex::Box*>
              ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)in_stack_fffffffffffffe30._M_current,
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)in_stack_fffffffffffffe28._M_current);
    in_stack_fffffffffffffe48 = local_40;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               in_stack_fffffffffffffe28._M_current);
    __gnu_cxx::
    __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
    __normal_iterator<amrex::Box*>
              ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)in_stack_fffffffffffffe30._M_current,
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)in_stack_fffffffffffffe28._M_current);
    in_stack_fffffffffffffe50 =
         std::vector<amrex::Box,_std::allocator<amrex::Box>_>::erase
                   (in_stack_fffffffffffffe48,in_stack_fffffffffffffe58,
                    in_stack_fffffffffffffe50._M_current);
    std::end<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
              ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               in_stack_fffffffffffffe28._M_current);
    __gnu_cxx::
    __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
    __normal_iterator<amrex::Box*>
              ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)in_stack_fffffffffffffe30._M_current,
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)in_stack_fffffffffffffe28._M_current);
    std::begin<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
              ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               in_stack_fffffffffffffe28._M_current);
    in_stack_fffffffffffffe30 =
         std::end<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
                   (in_stack_fffffffffffffe28._M_current);
    in_stack_fffffffffffffe28 =
         std::vector<amrex::Box,std::allocator<amrex::Box>>::
         insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                   (in_stack_fffffffffffffe70._M_current,in_RDI,in_stack_fffffffffffffe80._M_current
                    ,in_stack_fffffffffffffe78._M_current);
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_60);
  }
  BoxList::join((BoxList *)in_stack_fffffffffffffe60._M_current,
                (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                in_stack_fffffffffffffe58._M_current);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x127842d);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x127843a);
  return;
}

Assistant:

void
BoxDomain::add (const Box& b)
{
    BL_ASSERT(b.ixType() == ixType());

    Vector<Box> tmp, check;

    check.push_back(b);

    for (const auto& bx : *this)
    {
        tmp.clear();
        for (auto& cbx : check)
        {
            if (cbx.intersects(bx))
            {
                const BoxList& tmpbl = amrex::boxDiff(cbx, bx);
                tmp.insert(std::end(tmp), std::begin(tmpbl), std::end(tmpbl));
                cbx = Box();
            }
        }
        check.erase(std::remove_if(check.begin(), check.end(),
                                   [](const Box& x) { return x.isEmpty(); }),
                    check.end());
        check.insert(std::end(check), std::begin(tmp), std::end(tmp));
    }
    join(check);
    BL_ASSERT(ok());
}